

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

bool argagg::cmd_line_arg_is_option_flag(char *s)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ulong in_RAX;
  size_t sVar4;
  char *__s;
  bool bVar5;
  bool encountered_equal;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  sVar4 = strlen(s);
  if ((sVar4 < 2) || (*s != '-')) {
LAB_0010da5d:
    bVar5 = false;
  }
  else {
    cVar1 = s[1];
    if (cVar1 == '-') {
      if (sVar4 == 2) goto LAB_0010da5d;
      cVar2 = s[2];
      __s = s + 2;
    }
    else {
      __s = s + 1;
      cVar2 = cVar1;
    }
    iVar3 = isalnum((int)cVar2);
    bVar5 = iVar3 != 0;
    if ((cVar1 == '-') && (iVar3 != 0)) {
      sVar4 = strlen(__s);
      uStack_18 = uStack_18 & 0xffffffffffffff;
      bVar5 = std::
              all_of<char_const*,argagg::cmd_line_arg_is_option_flag(char_const*)::_lambda(char_const&)_1_>
                        (__s,__s + sVar4,(bool *)((long)&uStack_18 + 7));
    }
  }
  return bVar5;
}

Assistant:

inline
bool cmd_line_arg_is_option_flag(
  const char* s)
{
  auto len = std::strlen(s);

  // The shortest possible flag has two characters: a hyphen and an
  // alpha-numeric character.
  if (len < 2) {
    return false;
  }

  // All flags must start with a hyphen.
  if (s[0] != '-') {
    return false;
  }

  // Shift the name forward by a character to account for the initial hyphen.
  // This means if s was originally "-v" then name will be "v".
  const char* name = s + 1;

  // Check if we're dealing with a long flag.
  bool is_long = false;
  if (s[1] == '-') {
    is_long = true;

    // Just -- is not a valid flag.
    if (len == 2) {
      return false;
    }

    // Shift the name forward to account for the extra hyphen. This means if s
    // was originally "--output" then name will be "output".
    name = s + 2;
  }

  // The first character of the flag name must be alpha-numeric. This is to
  // prevent things like "---a" from being valid flags.
  len = std::strlen(name);
  if (!std::isalnum(name[0])) {
    return false;
  }

  // At this point in is_valid_flag_definition() we would check if the short
  // flag has only one character. At command line specification you can group
  // short flags together or even add an argument to a short flag without a
  // space delimiter. Thus we don't check if this has only one character
  // because it might not.

  // If this is a long flag then we expect all characters *up to* an equal sign
  // to be alpha-numeric or a hyphen. After the equal sign you are specify the
  // argument to a long flag which can be basically anything.
  if (is_long) {
    bool encountered_equal = false;
    return std::all_of(name, name + len, [&](const char& c) {
        if (encountered_equal) {
          return true;
        } else {
          if (c == '=') {
            encountered_equal = true;
            return true;
          }
          return std::isalnum(c) || c == '-';
        }
      });
  }

  // At this point we are not dealing with a long flag. We already checked that
  // the first character is alpha-numeric so we've got the case of a single
  // short flag covered. This might be a short flag group though and we might
  // be tempted to check that each character of the short flag group is
  // alpha-numeric. However, you can specify the argument for a short flag
  // without a space delimiter (e.g. "-I/usr/local/include") so you can't tell
  // if the rest of a short flag group is part of the argument or not unless
  // you know what is a defined flag or not. We leave that kind of processing
  // to the parser.
  return true;
}